

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O0

bool __thiscall OSToken::getTokenSerial(OSToken *this,ByteString *serial)

{
  ulong uVar1;
  long in_RDI;
  ByteString *in_stack_ffffffffffffff18;
  OSAttribute *this_00;
  OSAttribute local_b8;
  
  if (((*(byte *)(in_RDI + 8) & 1) != 0) &&
     (uVar1 = (**(code **)(**(long **)(in_RDI + 0xc0) + 0x50))(), (uVar1 & 1) != 0)) {
    uVar1 = (**(code **)(**(long **)(in_RDI + 0xc0) + 0x10))(*(long **)(in_RDI + 0xc0),0x8000534a);
    if ((uVar1 & 1) == 0) {
      return false;
    }
    this_00 = &local_b8;
    (**(code **)(**(long **)(in_RDI + 0xc0) + 0x18))(this_00,*(long **)(in_RDI + 0xc0),0x8000534a);
    OSAttribute::getByteStringValue(this_00);
    ByteString::operator=((ByteString *)this_00,in_stack_ffffffffffffff18);
    OSAttribute::~OSAttribute(this_00);
    return true;
  }
  return false;
}

Assistant:

bool OSToken::getTokenSerial(ByteString& serial)
{
	if (!valid || !tokenObject->isValid())
	{
		return false;
	}

	if (tokenObject->attributeExists(CKA_OS_TOKENSERIAL))
	{
		serial = tokenObject->getAttribute(CKA_OS_TOKENSERIAL).getByteStringValue();

		return true;
	}
	else
	{
		return false;
	}
}